

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O1

void display_map(int *cy,int *cx)

{
  ulong uVar1;
  ulong uVar2;
  void *p;
  void *pvVar3;
  loc lVar4;
  int iVar5;
  wchar_t wVar6;
  int iVar7;
  long lVar8;
  wchar_t wVar9;
  int iVar10;
  byte bVar11;
  int iVar12;
  wchar_t tc;
  wchar_t c;
  wchar_t ta;
  wchar_t a;
  wchar_t local_98;
  int local_94;
  ulong local_90;
  void *local_88;
  long local_80;
  monster_race *local_78;
  wchar_t *local_70;
  wchar_t *local_68;
  wchar_t map_wid;
  wchar_t map_hgt;
  grid_data g;
  
  local_78 = r_info;
  local_70 = cy;
  local_68 = cx;
  p = mem_zalloc((long)cave->height << 3);
  if (0 < cave->height) {
    lVar8 = 0;
    do {
      pvVar3 = mem_zalloc((long)cave->width);
      *(void **)((long)p + lVar8 * 8) = pvVar3;
      lVar8 = lVar8 + 1;
    } while (lVar8 < cave->height);
  }
  get_minimap_dimensions
            ((term_conflict *)Term,(chunk *)cave,(uint)tile_width,(uint)tile_height,&map_wid,
             &map_hgt);
  if (map_hgt < L'\x01' || map_wid < L'\x01') {
    if (0 < cave->height) {
      lVar8 = 0;
      do {
        mem_free(*(void **)((long)p + lVar8 * 8));
        lVar8 = lVar8 + 1;
      } while (lVar8 < cave->height);
    }
  }
  else {
    a = L'\x01';
    c = L' ';
    ta = L'\x01';
    tc = L' ';
    wVar6 = map_hgt + L'\x01';
    wVar9 = L'\0';
    local_90 = (ulong)(uint)map_hgt;
    local_88 = p;
    window_make(L'\0',L'\0',map_wid + L'\x01',wVar6);
    if (map_wid + L'\x01' < Term->wid + L'\xffffffff') {
      do {
        Term_erase(map_wid + L'\x02',wVar9,(Term->wid - map_wid) + L'\xfffffffe');
        wVar9 = wVar9 + L'\x01';
      } while (wVar6 != wVar9);
    }
    if (wVar6 < Term->hgt + L'\xffffffff') {
      for (wVar6 = (int)local_90 + L'\x02'; wVar6 < Term->hgt; wVar6 = wVar6 + L'\x01') {
        Term_erase(L'\0',wVar6,Term->wid);
      }
    }
    iVar5 = cave->height;
    if (iVar5 < 1) {
      iVar10 = (int)local_90;
    }
    else {
      iVar12 = 0;
      do {
        uVar1 = (long)(iVar12 * (int)local_90) / (long)iVar5;
        iVar5 = (int)uVar1;
        if (1 < tile_height) {
          iVar5 = iVar5 - (int)((long)((ulong)(uint)(iVar5 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                               (long)(int)(uint)tile_height);
        }
        iVar10 = cave->width;
        local_94 = iVar12;
        if (0 < iVar10) {
          local_80 = (long)iVar5;
          local_98 = iVar5 + L'\x01';
          iVar5 = 0;
          iVar12 = 0;
          do {
            iVar7 = (int)((long)iVar5 / (long)iVar10);
            if (1 < tile_width) {
              iVar7 = iVar7 - (int)((long)((ulong)(uint)(iVar7 >> 0x1f) << 0x20 |
                                          (long)iVar5 / (long)iVar10 & 0xffffffffU) %
                                   (long)(int)(uint)tile_width);
            }
            lVar4 = (loc)loc(iVar12,local_94);
            map_info(lVar4,&g);
            grid_data_as_text(&g,&a,&c,&ta,&tc);
            if ((a == ta) && (c == tc)) {
              bVar11 = f_info[g.f_idx].priority;
            }
            else {
              bVar11 = 0x14;
            }
            if (*(byte *)(*(long *)((long)local_88 + local_80 * 8) + (long)iVar7) < bVar11) {
              g.lighting = LIGHTING_LIT;
              grid_data_as_text(&g,&a,&c,&ta,&tc);
              Term_queue_char(Term,iVar7 + L'\x01',local_98,a,c,ta,tc);
              if ((1 < tile_width) || (1 < tile_height)) {
                Term_big_queue_char(Term,iVar7 + L'\x01',local_98,Term->hgt + L'\xffffffff',L'ÿ',
                                    L'\xffffffff',L'\0',L'\0');
              }
              *(byte *)(*(long *)((long)local_88 + local_80 * 8) + (long)iVar7) = bVar11;
            }
            iVar12 = iVar12 + 1;
            iVar10 = cave->width;
            iVar5 = iVar5 + map_wid;
          } while (iVar12 < iVar10);
        }
        iVar12 = local_94 + 1;
        iVar5 = cave->height;
        iVar10 = (int)local_90;
      } while (iVar12 < iVar5);
    }
    uVar1 = (long)((player->grid).y * iVar10) / (long)iVar5;
    iVar5 = (int)uVar1;
    uVar2 = (long)(map_wid * (player->grid).x) / (long)cave->width;
    iVar10 = (int)uVar2;
    if (1 < tile_width) {
      iVar10 = iVar10 - (int)((long)((ulong)(uint)(iVar10 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) %
                             (long)(int)(uint)tile_width);
    }
    if (1 < tile_height) {
      iVar5 = iVar5 - (int)((long)((ulong)(uint)(iVar5 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                           (long)(int)(uint)tile_height);
    }
    lVar4.x = (player->grid).x;
    lVar4.y = (player->grid).y;
    map_info(lVar4,&g);
    g.lighting = LIGHTING_LIT;
    grid_data_as_text(&g,&a,&c,&ta,&tc);
    a = (wchar_t)monster_x_attr[local_78->ridx];
    c = monster_x_char[local_78->ridx];
    wVar9 = iVar10 + L'\x01';
    wVar6 = iVar5 + L'\x01';
    Term_queue_char(Term,wVar9,wVar6,a,c,ta,tc);
    if ((1 < tile_width) || (1 < tile_height)) {
      Term_big_queue_char(Term,wVar9,wVar6,Term->hgt + L'\xffffffff',L'ÿ',L'\xffffffff',L'\0',L'\0'
                         );
    }
    p = local_88;
    if (local_70 != (wchar_t *)0x0) {
      *local_70 = wVar6;
    }
    if (local_68 != (wchar_t *)0x0) {
      *local_68 = wVar9;
    }
    if (0 < cave->height) {
      lVar8 = 0;
      do {
        mem_free(*(void **)((long)p + lVar8 * 8));
        lVar8 = lVar8 + 1;
      } while (lVar8 < cave->height);
    }
  }
  mem_free(p);
  return;
}

Assistant:

void display_map(int *cy, int *cx)
{
	int map_hgt, map_wid;
	int row, col;

	int x, y;
	struct grid_data g;

	int a, ta;
	wchar_t c, tc;

	uint8_t tp;

	struct monster_race *race = &r_info[0];

	/* Priority array */
	uint8_t **mp = mem_zalloc(cave->height * sizeof(uint8_t*));
	for (y = 0; y < cave->height; y++)
		mp[y] = mem_zalloc(cave->width * sizeof(uint8_t));

	/* Desired map height */
	get_minimap_dimensions(Term, cave, tile_width, tile_height,
		&map_wid, &map_hgt);

	/* Prevent accidents */
	if ((map_wid < 1) || (map_hgt < 1)) {
		for (y = 0; y < cave->height; y++)
			mem_free(mp[y]);
		mem_free(mp);
		return;
	}

	/* Nothing here */
	a = COLOUR_WHITE;
    c = L' ';
	ta = COLOUR_WHITE;
	tc = L' ';

	/* Draw a box around the edge of the term */
	window_make(0, 0, map_wid + 1, map_hgt + 1);

	/* Clear outside that boundary. */
	if (map_wid + 1 < Term->wid - 1) {
		for (y = 0; y < map_hgt + 1; y++) {
			Term_erase(map_wid + 2, y, Term->wid - map_wid - 2);
		}
	}
	if (map_hgt + 1 < Term->hgt - 1) {
		for (y = map_hgt + 2; y < Term->hgt; y++) {
			Term_erase(0, y, Term->wid);
		}
	}

	/* Analyze the actual map */
	for (y = 0; y < cave->height; y++) {
		row = (y * map_hgt) / cave->height;
		if (tile_height > 1) row = row - (row % tile_height);

		for (x = 0; x < cave->width; x++) {
			col = (x * map_wid) / cave->width;
			if (tile_width > 1) col = col - (col % tile_width);

			/* Get the attr/char at that map location */
			map_info(loc(x, y), &g);
			grid_data_as_text(&g, &a, &c, &ta, &tc);

			/* Get the priority of that attr/char */
			tp = f_info[g.f_idx].priority;

			/* Stuff on top of terrain gets higher priority */
			if ((a != ta) || (c != tc)) tp = 20;

			/* Save "best" */
			if (mp[row][col] < tp) {
				/* Hack - make every grid on the map lit */
				g.lighting = LIGHTING_LIT;
				grid_data_as_text(&g, &a, &c, &ta, &tc);

				Term_queue_char(Term, col + 1, row + 1, a, c, ta, tc);

				if ((tile_width > 1) || (tile_height > 1))
					Term_big_queue_char(Term, col + 1,
						row + 1, Term->hgt - 1,
						255, -1, 0, 0);

				/* Save priority */
				mp[row][col] = tp;
			}
		}
	}

	/*** Display the player ***/

	/* Player location */
	row = (player->grid.y * map_hgt / cave->height);
	col = (player->grid.x * map_wid / cave->width);

	if (tile_width > 1)
		col = col - (col % tile_width);
	if (tile_height > 1)
		row = row - (row % tile_height);

	/* Get the terrain at the player's spot. */
	map_info(player->grid, &g);
	g.lighting = LIGHTING_LIT;
	grid_data_as_text(&g, &a, &c, &ta, &tc);

	/* Get the "player" tile */
	a = monster_x_attr[race->ridx];
	c = monster_x_char[race->ridx];

	/* Draw the player */
	Term_queue_char(Term, col + 1, row + 1, a, c, ta, tc);

	if ((tile_width > 1) || (tile_height > 1))
		Term_big_queue_char(Term, col + 1, row + 1, Term->hgt - 1,
			255, -1, 0, 0);
  
	/* Return player location */
	if (cy != NULL) (*cy) = row + 1;
	if (cx != NULL) (*cx) = col + 1;

	for (y = 0; y < cave->height; y++)
		mem_free(mp[y]);
	mem_free(mp);
}